

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::init
          (LayeredRenderCase *this,EVP_PKEY_CTX *ctx)

{
  GLuint *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  LayeredRenderTargetType LVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  ContextType CVar9;
  int iVar10;
  deUint32 dVar11;
  int extraout_EAX;
  RenderTarget *pRVar12;
  undefined4 extraout_var;
  TextureFormat texFormat;
  TransferFormat TVar13;
  undefined4 extraout_var_00;
  ShaderProgram *pSVar14;
  pointer pcVar15;
  void *pvVar16;
  ostream *poVar17;
  ostream *poVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  NotSupportedError *pNVar19;
  long *plVar20;
  TestError *pTVar21;
  int iVar22;
  size_type *psVar23;
  long lVar24;
  undefined4 uVar25;
  char *pcVar26;
  undefined4 uVar27;
  undefined8 uVar28;
  ulong uVar29;
  int iVar30;
  size_type __dnew_1;
  value_type local_3b0;
  ContextType local_38c;
  string local_388;
  ScopedLogSection section;
  int numSamples;
  value_type local_358;
  int maxSamples;
  undefined4 uStack_334;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  string local_310;
  string local_2f0;
  ContextType local_2cc;
  size_type __dnew_2;
  _func_int **local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [6];
  ios_base local_258 [8];
  ios_base local_250 [264];
  ScopedLogSection section_1;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  ContextType local_104;
  size_type __dnew;
  pointer local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [8];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(CVar9,(ApiType)0x23);
  if ((!bVar8) &&
     (bVar8 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar8)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar19,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0xaca);
LAB_014136a4:
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_target == TARGET_2D_MS_ARRAY) {
    CVar9.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar8 = glu::contextSupports(CVar9,(ApiType)0x23);
    if ((!bVar8) &&
       (bVar8 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_OES_texture_storage_multisample_2d_array"), !bVar8)) {
      pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar19,
                 "Test requires OES_texture_storage_multisample_2d_array extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xacd);
      goto LAB_014136a4;
    }
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar12->m_width < (this->m_resolveDimensions).m_data[0]) ||
     (pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar12->m_height < (this->m_resolveDimensions).m_data[1])) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2f0._M_dataplus._M_p._0_4_ = (this->m_resolveDimensions).m_data[0];
    de::toString<int>((string *)&numSamples,(int *)&local_2f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_1,
                   "Render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numSamples)
    ;
    plVar20 = (long *)std::__cxx11::string::append((char *)&__dnew_1);
    __dnew = *plVar20;
    psVar23 = (size_type *)(plVar20 + 2);
    if ((size_type *)__dnew == psVar23) {
      local_f0[0]._0_8_ = *psVar23;
      local_f0[0]._8_8_ = plVar20[3];
      __dnew = (size_type)local_f0;
    }
    else {
      local_f0[0]._0_8_ = *psVar23;
    }
    local_f8 = (pointer)plVar20[1];
    *plVar20 = (long)psVar23;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    local_310._M_dataplus._M_p._0_4_ = (this->m_resolveDimensions).m_data[1];
    de::toString<int>((string *)&maxSamples,(int *)&local_310);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxSamples)
    ;
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&__dnew_2);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Rendering to the default layer.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_SINGLE_LAYER:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Rendering to a single layer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_ALL_LAYERS:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Rendering to all layers.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_DIFFERENT_LAYERS:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Outputting different number of vertices to each layer.",0x36);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_INVOCATION_PER_LAYER:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Using a different invocation to output to each layer.",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Outputting to each layer from multiple invocations.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_LAYER_ID:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Using gl_Layer in fragment shader.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Verifying LAYER_PROVOKING_VERTEX.",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_01411a96_default;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
  std::ios_base::~ios_base(local_250);
switchD_01411a96_default:
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var,iVar10);
  uVar29 = (ulong)this->m_target;
  iVar30 = 0;
  iVar10 = 0;
  iVar22 = 0;
  if (uVar29 < 5) {
    iVar10 = *(int *)(&DAT_01c7cdf8 + uVar29 * 4);
    iVar22 = *(int *)(&DAT_01c7cda8 + uVar29 * 4);
    iVar30 = 0x40;
  }
  texFormat = glu::mapGLInternalFormat(0x8058);
  TVar13 = glu::getTransferFormat(texFormat);
  pGVar1 = &this->m_texture;
  (**(code **)(lVar24 + 0x6f8))(1,pGVar1);
  dVar11 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar11,"gen texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xb6f);
  if (TARGET_2D_MS_ARRAY < this->m_target) goto LAB_0141230a;
  uVar29 = (ulong)TVar13 >> 0x20;
  switch(this->m_target) {
  case TARGET_CUBE:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating cubemap texture, size = ",0x21);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar24 + 0xb8))(0x8513,*pGVar1);
    (**(code **)(lVar24 + 0x1310))(0x8515,0,0x8058,iVar30,iVar10,0,TVar13,uVar29,0);
    (**(code **)(lVar24 + 0x1310))(0x8516,0,0x8058,iVar30,iVar10,0,TVar13,uVar29,0);
    (**(code **)(lVar24 + 0x1310))(0x8517,0,0x8058,iVar30,iVar10,0,TVar13,uVar29,0);
    (**(code **)(lVar24 + 0x1310))(0x8518,0,0x8058,iVar30,iVar10,0,TVar13,uVar29,0);
    (**(code **)(lVar24 + 0x1310))(0x8519,0,0x8058,iVar30,iVar10,0,TVar13,uVar29,0);
    uVar28 = 0x851a;
    break;
  case TARGET_3D:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 3d texture, size = ",0x1c);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar24 + 0xb8))(0x806f,*pGVar1);
    uVar28 = 0x806f;
    goto LAB_014122e5;
  case TARGET_1D_ARRAY:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 1d texture array, size = ",0x22);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", layers = ",0xb);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar24 + 0xb8))(0x8c18,*pGVar1);
    uVar28 = 0x8c18;
    break;
  case TARGET_2D_ARRAY:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 2d texture array, size = ",0x22);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", layers = ",0xb);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar24 + 0xb8))(0x8c1a,*pGVar1);
    uVar28 = 0x8c1a;
LAB_014122e5:
    (**(code **)(lVar24 + 0x1320))(uVar28,0,0x8058,iVar30,iVar10,iVar22,0,TVar13,uVar29,0);
    goto LAB_0141230a;
  case TARGET_2D_MS_ARRAY:
    numSamples = 2;
    _maxSamples = _maxSamples & 0xffffffff00000000;
    (**(code **)(lVar24 + 0x868))(0x910e);
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 2d multisample texture array, size = ",0x2e);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", layers = ",0xb);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", samples = ",0xc);
    std::ostream::operator<<((ostringstream *)&local_2c0,numSamples);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    if (maxSamples < 2) {
      pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)&__dnew_1,&numSamples);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                     "Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_1)
      ;
      plVar20 = (long *)std::__cxx11::string::append((char *)&__dnew);
      __dnew_2 = *plVar20;
      psVar23 = (size_type *)(plVar20 + 2);
      if ((size_type *)__dnew_2 == psVar23) {
        local_2b8[0]._0_8_ = *psVar23;
        local_2b8[0]._8_8_ = plVar20[3];
        __dnew_2 = (size_type)local_2b8;
      }
      else {
        local_2b8[0]._0_8_ = *psVar23;
      }
      local_2c0 = (_func_int **)plVar20[1];
      *plVar20 = (long)psVar23;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)&__dnew_2);
      __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar24 + 0xb8))(0x9102,*pGVar1);
    (**(code **)(lVar24 + 0x13a8))(0x9102,2,0x8058,iVar30,iVar10,iVar22,1);
    goto LAB_0141230a;
  }
  (**(code **)(lVar24 + 0x1310))(uVar28,0,0x8058,iVar30,iVar10,0,TVar13,uVar29,0);
LAB_0141230a:
  dVar11 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar11,"tex image",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xba4);
  LVar3 = this->m_target;
  if ((ulong)LVar3 != 4) {
    uVar25 = 0;
    uVar27 = 0;
    if (LVar3 < TARGET_2D_MS_ARRAY) {
      uVar27 = *(undefined4 *)(&DAT_01c7c070 + (ulong)LVar3 * 4);
    }
    (**(code **)(lVar24 + 0x1360))(uVar27,0x2800,0x2600);
    if ((ulong)this->m_target < 5) {
      uVar25 = *(undefined4 *)(&DAT_01c7ce0c + (ulong)this->m_target * 4);
    }
    (**(code **)(lVar24 + 0x1360))(uVar25,0x2801,0x2600);
    uVar25 = 0;
    uVar27 = 0;
    if ((ulong)this->m_target < 5) {
      uVar27 = *(undefined4 *)(&DAT_01c7ce0c + (ulong)this->m_target * 4);
    }
    (**(code **)(lVar24 + 0x1360))(uVar27,0x2802,0x2901);
    if ((ulong)this->m_target < 5) {
      uVar25 = *(undefined4 *)(&DAT_01c7ce0c + (ulong)this->m_target * 4);
    }
    (**(code **)(lVar24 + 0x1360))(uVar25,0x2803,0x2901);
    uVar27 = 0;
    if ((ulong)this->m_target < 5) {
      uVar27 = *(undefined4 *)(&DAT_01c7ce0c + (ulong)this->m_target * 4);
    }
    (**(code **)(lVar24 + 0x1360))(uVar27,0x8072,0x2901);
    dVar11 = (**(code **)(lVar24 + 0x800))();
    glu::checkError(dVar11,"tex filter",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0xbae);
  }
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var_00,iVar10);
  __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"Creating FBO",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
  std::ios_base::~ios_base(local_250);
  (**(code **)(lVar24 + 0x6d0))(1,&this->m_fbo);
  (**(code **)(lVar24 + 0x78))(0x8d40,this->m_fbo);
  (**(code **)(lVar24 + 0x690))(0x8d40,0x8ce0,this->m_texture,0);
  (**(code **)(lVar24 + 0x78))(0x8d40,0);
  dVar11 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar11,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xbbf);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  __dnew_2 = (size_type)local_2b8;
  __dnew = 0x15;
  __dnew_2 = std::__cxx11::string::_M_create(&__dnew_2,(ulong)&__dnew);
  local_2b8[0]._M_allocated_capacity = __dnew;
  builtin_strncpy((char *)__dnew_2,"RenderToTextureShader",0x15);
  local_2c0 = (_func_int **)__dnew;
  *(char *)(__dnew_2 + __dnew) = '\0';
  __dnew_1 = 0x27;
  __dnew = (size_type)local_f0;
  __dnew = std::__cxx11::string::_M_create(&__dnew,(ulong)&__dnew_1);
  local_f0[0]._M_allocated_capacity = __dnew_1;
  builtin_strncpy((char *)__dnew,"Create layered rendering shader program",0x27);
  local_f8 = (pointer)__dnew_1;
  *(char *)(__dnew + __dnew_1) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)&__dnew_2,(string *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_f0) {
    operator_delete((void *)__dnew,local_f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != local_2b8) {
    operator_delete((void *)__dnew_2,local_2b8[0]._M_allocated_capacity + 1);
  }
  pSVar14 = (ShaderProgram *)operator_new(0xd0);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(&__dnew,0,0xac);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  __dnew_2 = 0x53;
  pcVar15 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)&__dnew_2);
  sVar7 = __dnew_2;
  local_388.field_2._M_allocated_capacity = __dnew_2;
  local_388._M_dataplus._M_p = pcVar15;
  memcpy(pcVar15,
         "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
         ,0x53);
  local_388._M_string_length = sVar7;
  pcVar15[sVar7] = '\0';
  local_104.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_310,&local_388,&local_104);
  __dnew_1 = __dnew_1 & 0xffffffff00000000;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_310._M_dataplus._M_p,
             local_310._M_dataplus._M_p + local_310._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (__dnew_1 & 0xffffffff) * 3),&local_3b0);
  local_38c.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (this->m_test == TEST_LAYER_ID) {
    __dnew_2 = (size_type)local_2b8;
    _maxSamples = (pointer)0x12d;
    pvVar16 = (void *)std::__cxx11::string::_M_create(&__dnew_2,(ulong)&maxSamples);
    _Var6._M_p = _maxSamples;
    local_2b8[0]._M_allocated_capacity = _maxSamples;
    __dnew_2 = (size_type)pvVar16;
    memcpy(pvVar16,
           "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(((gl_Layer % 2) == 1) ? 1.0 : 0.5,\n\t                 (((gl_Layer / 2) % 2) == 1) ? 1.0 : 0.5,\n\t                 (gl_Layer == 0) ? 1.0 : 0.0,\n\t                 1.0);\n}\n"
           ,0x12d);
    local_2c0 = (_func_int **)_Var6._M_p;
    *((long)pvVar16 + _Var6._M_p) = '\0';
    specializeShader((string *)&section_1,(string *)&__dnew_2,&local_38c);
  }
  else {
    __dnew_2 = (size_type)local_2b8;
    _maxSamples = (pointer)0x9c;
    pvVar16 = (void *)std::__cxx11::string::_M_create(&__dnew_2,(ulong)&maxSamples);
    _Var6._M_p = _maxSamples;
    local_2b8[0]._M_allocated_capacity = _maxSamples;
    __dnew_2 = (size_type)pvVar16;
    memcpy(pvVar16,
           "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
           ,0x9c);
    local_2c0 = (_func_int **)_Var6._M_p;
    *((long)pvVar16 + _Var6._M_p) = '\0';
    specializeShader((string *)&section_1,(string *)&__dnew_2,&local_38c);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != local_2b8) {
    operator_delete((void *)__dnew_2,local_2b8[0]._M_allocated_capacity + 1);
  }
  numSamples = 1;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,section_1.m_log,(long)&(section_1.m_log)->m_log + local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (ulong)(uint)numSamples * 3),&local_358);
  local_2cc.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  switch(this->m_test) {
  case TEST_ALL_LAYERS:
  case TEST_LAYER_ID:
    iVar10 = this->m_numLayers << 2;
    break;
  case TEST_DIFFERENT_LAYERS:
    iVar10 = (this->m_numLayers + 1) * this->m_numLayers;
    break;
  default:
    iVar10 = (uint)(this->m_test == TEST_LAYER_PROVOKING_VERTEX) * 2 + 4;
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    iVar10 = 6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__dnew_2);
  poVar17 = (ostream *)&__dnew_2;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}",0x30);
  if ((this->m_test & ~TEST_SINGLE_LAYER) == TEST_INVOCATION_PER_LAYER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,"layout(points, invocations=",0x1b);
    poVar17 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    lVar24 = 6;
    pcVar26 = ") in;\n";
  }
  else {
    lVar24 = 0x13;
    pcVar26 = "layout(points) in;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar26,lVar24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew_2,"layout(triangle_strip, max_vertices = ",0x26);
  poVar17 = (ostream *)&__dnew_2;
  poVar18 = (ostream *)std::ostream::operator<<(poVar17,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar18,") out;\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n",0x3c);
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    lVar24 = 0x18c;
    pcVar26 = 
    "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n"
    ;
    break;
  case TEST_SINGLE_LAYER:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,0x6c);
    poVar17 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_targetLayer);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,100);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->m_targetLayer);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,100);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->m_targetLayer);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,100);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->m_targetLayer);
    lVar24 = 0x2c;
    pcVar26 = ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n";
    break;
  case TEST_ALL_LAYERS:
  case TEST_LAYER_ID:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white   = vec4(1.0, 1.0, 1.0, 1.0);\n\tconst highp vec4 red     = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green   = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue    = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow  = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 magenta = vec4(1.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 colors[6] = vec4[6](white, red, green, blue, yellow, magenta);\n\n\tfor (mediump int layerNdx = 0; layerNdx < "
               ,0x1c1);
    poVar17 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    lVar24 = 0x211;
    pcVar26 = 
    "; ++layerNdx)\n\t{\n\t\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n"
    ;
    break;
  case TEST_DIFFERENT_LAYERS:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tfor (mediump int layerNdx = 0; layerNdx < "
               ,0x60);
    poVar17 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               "; ++layerNdx)\n\t{\n\t\tfor (mediump int colNdx = 0; colNdx <= layerNdx; ++colNdx)\n\t\t{\n\t\t\thighp float posX = float(colNdx) / float("
               ,0x7e);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->m_numLayers);
    lVar24 = 0x110;
    pcVar26 = 
    ") * 2.0 - 1.0;\n\n\t\t\tgl_Position = vec4(posX,  1.0, 0.0, 1.0);\n\t\t\tgl_Layer = layerNdx;\n\t\t\tv_frag_FragColor = white;\n\t\t\tEmitVertex();\n\n\t\t\tgl_Position = vec4(posX, -1.0, 0.0, 1.0);\n\t\t\tgl_Layer = layerNdx;\n\t\t\tv_frag_FragColor = white;\n\t\t\tEmitVertex();\n\t\t}\n\t\tEndPrimitive();\n\t}\n"
    ;
    break;
  case TEST_INVOCATION_PER_LAYER:
    lVar24 = 0x3ba;
    pcVar26 = 
    "\tconst highp vec4 white   = vec4(1.0, 1.0, 1.0, 1.0);\n\tconst highp vec4 red     = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green   = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue    = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow  = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 magenta = vec4(1.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 colors[6] = vec4[6](white, red, green, blue, yellow, magenta);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\tEndPrimitive();\n"
    ;
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tmediump int layerA = gl_InvocationID;\n\tmediump int layerB = (gl_InvocationID + 1) % "
               ,0x8a);
    poVar17 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,";\n\thighp float aEnd = float(layerA) / float(",0x2c);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->m_numLayers);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,") * 2.0 - 1.0;\n\thighp float bEnd = float(layerB) / float(",0x39);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->m_numLayers);
    lVar24 = 0x2af;
    pcVar26 = 
    ") * 2.0 - 1.0;\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n"
    ;
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    lVar24 = 0x2a4;
    pcVar26 = 
    "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 0;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 0;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n"
    ;
    break;
  default:
    goto switchD_014129ef_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar26,lVar24);
switchD_014129ef_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&__dnew_2,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_128,&local_2f0,&local_2cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p) !=
      &local_2f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p),
                    local_2f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__dnew_2);
  std::ios_base::~ios_base(local_258);
  maxSamples = 2;
  local_330._0_8_ = &local_320;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_330,
             CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
             local_128._M_string_length +
             CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + ((ulong)_maxSamples & 0xffffffff) * 3),(value_type *)local_330);
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar5,(ProgramSources *)&__dnew);
  this->m_renderShader = pSVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._0_8_ != &local_320) {
    operator_delete((void *)local_330._0_8_,local_320._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) !=
      &local_128.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
                    local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)section_1.m_log != &local_138) {
    operator_delete(section_1.m_log,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._0_8_ + 1);
  }
  paVar2 = &local_310.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&__dnew + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_renderShader);
  if ((this->m_renderShader->m_program).m_info.linkOk == false) {
    pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
    __dnew_2 = (size_type)local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew_2,"failed to build render shader","");
    tcu::TestError::TestError(pTVar21,(string *)&__dnew_2);
    __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestLog::endSection((TestLog *)CONCAT44(section.m_log._4_4_,(int)section.m_log));
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  __dnew_2 = (size_type)local_2b8;
  __dnew = 0x14;
  __dnew_2 = std::__cxx11::string::_M_create(&__dnew_2,(ulong)&__dnew);
  local_2b8[0]._M_allocated_capacity = __dnew;
  builtin_strncpy((char *)__dnew_2,"TextureSamplerShader",0x14);
  local_2c0 = (_func_int **)__dnew;
  *(char *)(__dnew_2 + __dnew) = '\0';
  __dnew_1 = 0x1d;
  __dnew = (size_type)local_f0;
  __dnew = std::__cxx11::string::_M_create(&__dnew,(ulong)&__dnew_1);
  local_f0[0]._M_allocated_capacity = __dnew_1;
  builtin_strncpy((char *)__dnew,"Create shader sampler program",0x1d);
  local_f8 = (pointer)__dnew_1;
  *(char *)(__dnew + __dnew_1) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar4,(string *)&__dnew_2,(string *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_f0) {
    operator_delete((void *)__dnew,local_f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != local_2b8) {
    operator_delete((void *)__dnew_2,local_2b8[0]._M_allocated_capacity + 1);
  }
  pSVar14 = (ShaderProgram *)operator_new(0xd0);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(&__dnew,0,0xac);
  __dnew_2 = 0x5f;
  local_310._M_dataplus._M_p = (pointer)paVar2;
  pcVar15 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&__dnew_2);
  sVar7 = __dnew_2;
  local_310.field_2._M_allocated_capacity = __dnew_2;
  local_310._M_dataplus._M_p = pcVar15;
  memcpy(pcVar15,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0x5f);
  local_310._M_string_length = sVar7;
  pcVar15[sVar7] = '\0';
  local_128._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2f0,&local_310,(ContextType *)&local_128);
  __dnew_1 = __dnew_1 & 0xffffffff00000000;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,
             CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p),
             local_2f0._M_string_length +
             CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (__dnew_1 & 0xffffffff) * 3),&local_3b0);
  section.m_log._0_4_ = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])()
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__dnew_2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew_2,"${GLSL_VERSION_DECL}\n",0x15);
  if (this->m_target == TARGET_2D_MS_ARRAY) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,"${GLSL_OES_TEXTURE_STORAGE_MULTISAMPLE}",0x27);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew_2,"layout(location = 0) out mediump vec4 fragColor;\n",0x31);
  uVar29 = (ulong)this->m_target;
  if (uVar29 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,&DAT_01c7cdbc + *(int *)(&DAT_01c7cdbc + uVar29 * 4),
               *(long *)(&DAT_01c7cdd0 + uVar29 * 8));
  }
  poVar17 = (ostream *)&__dnew_2;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,"uniform highp int u_layer;\nvoid main (void)\n{\n",0x2e);
  switch(this->m_target) {
  case TARGET_CUBE:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,"\thighp vec2 facepos = 2.0 * gl_FragCoord.xy / vec2(ivec2(",
               0x39);
    poVar17 = (ostream *)std::ostream::operator<<(&__dnew_2,(this->m_resolveDimensions).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,(this->m_resolveDimensions).m_data[1]);
    lVar24 = 0x29a;
    pcVar26 = 
    ")) - vec2(1.0, 1.0);\n\tif (u_layer == 0)\n\t\tfragColor = textureLod(u_sampler, vec3(1.0, -facepos.y, -facepos.x), 0.0);\n\telse if (u_layer == 1)\n\t\tfragColor = textureLod(u_sampler, vec3(-1.0, -facepos.y, facepos.x), 0.0);\n\telse if (u_layer == 2)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, 1.0, facepos.y), 0.0);\n\telse if (u_layer == 3)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, -1.0, -facepos.y), 0.0);\n\telse if (u_layer == 4)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, -facepos.y, 1.0), 0.0);\n\telse if (u_layer == 5)\n\t\tfragColor = textureLod(u_sampler, vec3(-facepos.x, -facepos.y, -1.0), 0.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 1.0, 1.0);\n"
    ;
    break;
  case TARGET_3D:
  case TARGET_2D_ARRAY:
  case TARGET_2D_MS_ARRAY:
    lVar24 = 0x7a;
    pcVar26 = 
    "\thighp ivec2 screenpos = ivec2(floor(gl_FragCoord.xy));\n\tfragColor = texelFetch(u_sampler, ivec3(screenpos, u_layer), 0);\n"
    ;
    break;
  case TARGET_1D_ARRAY:
    lVar24 = 0x7c;
    pcVar26 = 
    "\thighp ivec2 screenpos = ivec2(floor(gl_FragCoord.xy));\n\tfragColor = texelFetch(u_sampler, ivec2(screenpos.x, u_layer), 0);\n"
    ;
    break;
  default:
    goto switchD_01413152_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar26,lVar24);
switchD_01413152_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&__dnew_2,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_388,(string *)&maxSamples,(ContextType *)&section);
  if (_maxSamples != local_330 + 8) {
    operator_delete(_maxSamples,local_330._8_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__dnew_2);
  std::ios_base::~ios_base(local_258);
  numSamples = 1;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (ulong)(uint)numSamples * 3),&local_358);
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar5,(ProgramSources *)&__dnew);
  this->m_samplerShader = pSVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p) !=
      &local_2f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p),
                    local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&__dnew + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_samplerShader);
  if ((this->m_samplerShader->m_program).m_info.linkOk == false) {
    pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
    __dnew_2 = (size_type)local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew_2,"failed to build sampler shader","");
    tcu::TestError::TestError(pTVar21,(string *)&__dnew_2);
    __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar10 = (**(code **)(CONCAT44(extraout_var_01,iVar10) + 0xb48))
                     ((this->m_samplerShader->m_program).m_program,"u_sampler");
  this->m_samplerSamplerLoc = iVar10;
  if (iVar10 == -1) {
    pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
    __dnew_2 = (size_type)local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew_2,"u_sampler uniform location = -1","");
    tcu::TestError::TestError(pTVar21,(string *)&__dnew_2);
    __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar10 = (**(code **)(CONCAT44(extraout_var_02,iVar10) + 0xb48))
                     ((this->m_samplerShader->m_program).m_program,"u_layer");
  this->m_samplerLayerLoc = iVar10;
  if (iVar10 != -1) {
    tcu::TestLog::endSection(section_1.m_log);
    return extraout_EAX;
  }
  pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
  __dnew_2 = (size_type)local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__dnew_2,"u_layer uniform location = -1","");
  tcu::TestError::TestError(pTVar21,(string *)&__dnew_2);
  __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LayeredRenderCase::init (void)
{
	// Requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	if (m_target == TARGET_2D_MS_ARRAY && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension or higher context version.");

	if (m_context.getRenderTarget().getWidth() < m_resolveDimensions.x() || m_context.getRenderTarget().getHeight() < m_resolveDimensions.y())
		throw tcu::NotSupportedError("Render target size must be at least " + de::toString(m_resolveDimensions.x()) + "x" + de::toString(m_resolveDimensions.y()));

	// log what the test tries to do

	if (m_test == TEST_DEFAULT_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to the default layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_SINGLE_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to a single layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_ALL_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to all layers." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_DIFFERENT_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Outputting different number of vertices to each layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_INVOCATION_PER_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Using a different invocation to output to each layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_MULTIPLE_LAYERS_PER_INVOCATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Outputting to each layer from multiple invocations." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_LAYER_ID)
		m_testCtx.getLog() << tcu::TestLog::Message << "Using gl_Layer in fragment shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_LAYER_PROVOKING_VERTEX)
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying LAYER_PROVOKING_VERTEX." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	// init resources

	initTexture();
	initFbo();
	initRenderShader();
	initSamplerShader();
}